

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XSAXMLScanner::scanStartTag(XSAXMLScanner *this,bool *gotData)

{
  ElemStack *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  bool bVar2;
  Grammar *pGVar3;
  XMLStringPool *pXVar4;
  MemoryManager *pMVar5;
  ReaderMgr *pRVar6;
  XMLDocumentHandler *pXVar7;
  bool bVar8;
  bool bVar9;
  XMLCh XVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  GrammarType GVar14;
  XMLSize_t XVar15;
  StackElem *pSVar16;
  XMLValidator *pXVar17;
  int *piVar18;
  XMLContentModel *cm;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar19;
  undefined4 extraout_var_03;
  SchemaElementDecl *this_02;
  XMLCh *pXVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ComplexTypeInfo **ppCVar21;
  XMLBuffer *pXVar22;
  XMLCh *pXVar23;
  undefined4 extraout_var_06;
  XMLSize_t XVar24;
  ComplexTypeInfo *pCVar25;
  size_t __n;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  bool isEmpty;
  uint local_c0;
  int prefixColonPos;
  undefined8 local_b8;
  uint local_ac;
  ElemStack *local_a8;
  XMLSize_t local_a0;
  XMLSize_t local_98;
  XMLSize_t local_90;
  MemoryManager *local_88;
  bool *local_80;
  QName element;
  ContentLeafNameTypeVector *cv;
  
  *gotData = true;
  (this->super_SGXMLScanner).fContent.fIndex = 0;
  pRVar6 = &(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr;
  pXVar22 = &(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf;
  (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex = 0;
  bVar8 = XMLReader::getQName((this->super_SGXMLScanner).super_XMLScanner.fReaderMgr.fCurReader,
                              pXVar22,&prefixColonPos);
  if (!bVar8) {
    XVar24 = pXVar22->fIndex;
    if (XVar24 == 0) {
      XMLScanner::emitError((XMLScanner *)this,ExpectedElementName);
    }
    else {
      pXVar23 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
      pXVar23[XVar24] = L'\0';
      XMLScanner::emitError
                ((XMLScanner *)this,InvalidElementName,pXVar23,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar10 = ReaderMgr::getNextChar(pRVar6);
      if (XVar10 == L'\0') {
        return bVar8;
      }
    } while (XVar10 != L'<');
    return bVar8;
  }
  this_00 = &(this->super_SGXMLScanner).super_XMLScanner.fElemStack;
  XVar24 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop;
  ReaderMgr::skipPastSpaces(pRVar6);
  pXVar23 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  pXVar23[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  XVar15 = SGXMLScanner::rawAttrScan
                     (&this->super_SGXMLScanner,pXVar23,(this->super_SGXMLScanner).fRawAttrList,
                      &isEmpty);
  local_c0 = 0xfffffffe;
  local_a8 = this_00;
  local_a0 = XVar24;
  local_98 = XVar15;
  local_80 = gotData;
  if (XVar24 == 0) {
    local_b8 = 0;
    cm = (XMLContentModel *)0x0;
    cv = (ContentLeafNameTypeVector *)0x0;
  }
  else {
    pSVar16 = ElemStack::topElement(this_00);
    XVar15 = local_98;
    pCVar25 = (ComplexTypeInfo *)pSVar16->fThisElement[1].fId;
    piVar18 = (int *)&pSVar16->fThisElement->field_0x2c;
    if (pCVar25 != (ComplexTypeInfo *)0x0) {
      piVar18 = &pCVar25->fContentType;
    }
    if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
      pXVar17 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      if ((pXVar17[4].fReaderMgr)->fCurReader != (XMLReader *)0x0) {
        pXVar17 = (XMLValidator *)
                  ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                            ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pXVar17[4].fReaderMgr);
        pCVar25 = (ComplexTypeInfo *)pXVar17->_vptr_XMLValidator;
        if (pCVar25 != (ComplexTypeInfo *)0x0) {
          piVar18 = &pCVar25->fContentType;
          goto LAB_002c21bf;
        }
      }
LAB_002c22a2:
      local_b8 = CONCAT71((int7)((ulong)pXVar17 >> 8),1);
    }
    else {
LAB_002c21bf:
      uVar13 = *piVar18;
      pXVar17 = (XMLValidator *)(ulong)uVar13;
      if (uVar13 - 2 < 3) {
        cm = pCVar25->fContentModel;
        if ((cm == (XMLContentModel *)0x0) && (pCVar25->fContentSpec != (ContentSpecNode *)0x0)) {
          cm = ComplexTypeInfo::makeContentModel(pCVar25,false);
          pCVar25->fContentModel = cm;
        }
        iVar11 = (*cm->_vptr_XMLContentModel[5])(cm);
        cv = (ContentLeafNameTypeVector *)CONCAT44(extraout_var_00,iVar11);
        local_c0 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
                   [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->
                   fCurrentScope;
        local_b8 = 0;
        goto LAB_002c22be;
      }
      if (uVar13 == 1) goto LAB_002c22a2;
      local_b8 = 0;
    }
    cm = (XMLContentModel *)0x0;
    cv = (ContentLeafNameTypeVector *)0x0;
  }
LAB_002c22be:
  local_90 = ElemStack::addLevel(local_a8);
  pSVar16 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
            [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  pSVar16->fValidationFlag = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  pSVar16->fPrefixColonPos = prefixColonPos;
  if (XVar15 != 0) {
    scanRawAttrListforNameSpaces(this,XVar15);
  }
  local_ac = XMLScanner::resolveQNameWithColon
                       ((XMLScanner *)this,pXVar23,
                        &(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf,Mode_Element,
                        prefixColonPos);
  bVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  if (cv != (ContentLeafNameTypeVector *)0x0) {
    pXVar20 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar20[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    QName::QName(&element,pXVar20,pXVar23 + (long)prefixColonPos + 1,local_ac,
                 (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
    bVar9 = SGXMLScanner::laxElementValidation
                      (&this->super_SGXMLScanner,&element,cv,cm,local_90 - 1);
    local_b8 = CONCAT71(extraout_var,bVar9);
    QName::~QName(&element);
  }
  uVar13 = local_ac;
  pXVar20 = pXVar23 + (long)prefixColonPos + 1;
  pGVar3 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  iVar11 = (*(pGVar3->super_XSerializable)._vptr_XSerializable[0xb])(pGVar3,(ulong)local_ac,pXVar20)
  ;
  this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_01,iVar11);
  if (this_02 == (SchemaElementDecl *)0x0) {
    pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fURIStringPool;
    iVar11 = (*(((this->super_SGXMLScanner).super_XMLScanner.fGrammar)->super_XSerializable).
               _vptr_XSerializable[6])();
    uVar12 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[9])
                       (pXVar4,CONCAT44(extraout_var_02,iVar11));
    if (uVar13 != uVar12) {
      pXVar19 = XMLScanner::getURIText((XMLScanner *)this,uVar13);
      switchGrammar(this,pXVar19,local_b8._0_1_);
    }
    pGVar3 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
    iVar11 = (*(pGVar3->super_XSerializable)._vptr_XSerializable[0xb])(pGVar3,(ulong)uVar13,pXVar20)
    ;
    this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_03,iVar11);
    if ((this_02 != (SchemaElementDecl *)0x0) ||
       (this_02 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                  getByKey((this->super_SGXMLScanner).fElemNonDeclPool,pXVar20,uVar13,-2),
       this_02 != (SchemaElementDecl *)0x0)) goto LAB_002c2445;
    local_88 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
    this_02 = (SchemaElementDecl *)XMemory::operator_new(0x80,local_88);
    pXVar19 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar19[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    SchemaElementDecl::SchemaElementDecl
              (this_02,pXVar19,pXVar20,uVar13,Any,0xfffffffe,
               (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
    XVar24 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                       ((this->super_SGXMLScanner).fElemNonDeclPool,
                        ((this_02->super_XMLElementDecl).fElementName)->fLocalPart,uVar13,-2,this_02
                       );
    (this_02->super_XMLElementDecl).fId = XVar24;
    bVar9 = true;
  }
  else {
LAB_002c2445:
    bVar9 = false;
  }
  pXVar17 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
  if (pXVar17 == (XMLValidator *)0x0) {
    bVar28 = false;
  }
  else {
    bVar28 = pXVar17[1].fReaderMgr != (ReaderMgr *)0x0;
  }
  if ((bVar9) || ((this_02->super_XMLElementDecl).fCreateReason != Declared)) {
    if ((char)local_b8 == '\x01' && !bVar28) {
      (this->super_SGXMLScanner).super_XMLScanner.fValidate = false;
      (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
      [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag =
           false;
    }
    else if ((((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) != 0) &&
            ((this_02->super_XMLElementDecl).fCreateReason = JustFaultIn, !bVar28)) {
      pXVar20 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      XMLValidator::emitError
                (pXVar17,ElementNotDefined,pXVar20,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  ElemStack::setElement
            (local_a8,&this_02->super_XMLElementDecl,
             ((this->super_SGXMLScanner).super_XMLScanner.fReaderMgr.fCurReader)->fReaderNum);
  (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
  [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentURI = uVar13;
  if (local_a0 == 0) {
    pMVar5 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
    __n = 0;
    do {
      psVar1 = (short *)((long)pXVar23 + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar11 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,__n);
    memcpy((XMLCh *)CONCAT44(extraout_var_04,iVar11),pXVar23,__n);
    (this->super_SGXMLScanner).super_XMLScanner.fRootElemName =
         (XMLCh *)CONCAT44(extraout_var_04,iVar11);
  }
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    (*((this->super_SGXMLScanner).super_XMLScanner.fValidator)->_vptr_XMLValidator[9])();
  }
  pXVar23 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  pXVar23[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  lVar26 = 0;
  do {
    psVar1 = (short *)((long)pXVar23 + lVar26);
    lVar26 = lVar26 + 2;
  } while (*psVar1 != 0);
  uVar27 = (lVar26 >> 1) - 1;
  XVar24 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop;
  pSVar16 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar24 - 1];
  if (pSVar16->fSchemaElemNameMaxLen <= uVar27) {
    pXVar20 = pSVar16->fSchemaElemName;
    pSVar16->fSchemaElemNameMaxLen = uVar27 * 2;
    pMVar5 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fMemoryManager;
    iVar11 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,uVar27 * 4);
    (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar24 - 1]->fSchemaElemName =
         (XMLCh *)CONCAT44(extraout_var_05,iVar11);
    pMVar5 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fMemoryManager;
    (*pMVar5->_vptr_MemoryManager[4])(pMVar5,pXVar20);
    pSVar16 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar24 - 1];
  }
  XMLString::copyString(pSVar16->fSchemaElemName,pXVar23);
  XVar24 = local_a0;
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    pRVar6 = (this->super_SGXMLScanner).super_XMLScanner.fValidator[4].fReaderMgr;
    if (pRVar6->fCurReader == (XMLReader *)0x0) goto LAB_002c26a8;
    ppCVar21 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                         ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pRVar6);
  }
  else {
    ppCVar21 = &this_02->fComplexTypeInfo;
  }
  pCVar25 = *ppCVar21;
  if (pCVar25 != (ComplexTypeInfo *)0x0) {
    local_c0 = pCVar25->fScopeDefined;
    pXVar23 = pCVar25->fTypeName;
    uVar13 = XMLString::indexOf(pXVar23,L',');
    XVar24 = local_a0;
    if (0 < (int)uVar13) {
      this_01 = &(this->super_SGXMLScanner).super_XMLScanner.fBufMgr;
      pXVar22 = XMLBufferMgr::bidOnBuffer(this_01);
      element.super_XSerializable._vptr_XSerializable = (_func_int **)pXVar22;
      element.fPrefixBufSz = (XMLSize_t)this_01;
      XMLBuffer::append(pXVar22,pXVar23,(ulong)uVar13);
      pXVar23 = pXVar22->fBuffer;
      pXVar23[pXVar22->fIndex] = L'\0';
      switchGrammar(this,pXVar23,local_b8._0_1_);
      XMLBufferMgr::releaseBuffer(this_01,pXVar22);
      XVar24 = local_a0;
    }
  }
LAB_002c26a8:
  pSVar16 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
            [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  pSVar16->fCurrentScope = local_c0;
  if ((this->super_SGXMLScanner).fElemStateSize <= local_90) {
    SGXMLScanner::resizeElemState(&this->super_SGXMLScanner);
    pSVar16 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
              [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  }
  (this->super_SGXMLScanner).fElemState[local_90] = 0;
  (this->super_SGXMLScanner).fElemLoopState[local_90] = 0;
  pSVar16->fCurrentGrammar = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  if ((XVar24 != 0) && (bVar2 != false)) {
    ElemStack::addChild(local_a8,(this_02->super_XMLElementDecl).fElementName,true);
  }
  XVar15 = SGXMLScanner::buildAttList
                     (&this->super_SGXMLScanner,(this->super_SGXMLScanner).fRawAttrList,local_98,
                      &this_02->super_XMLElementDecl,
                      (this->super_SGXMLScanner).super_XMLScanner.fAttrList);
  if (XVar15 != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll
              ((this->super_SGXMLScanner).fUndeclaredAttrRegistry);
  }
  pXVar7 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
  if (pXVar7 != (XMLDocumentHandler *)0x0) {
    pXVar23 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar23[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    (*pXVar7->_vptr_XMLDocumentHandler[0xb])
              (pXVar7,this_02,(ulong)local_ac,pXVar23,
               (this->super_SGXMLScanner).super_XMLScanner.fAttrList,XVar15,0,(ulong)(XVar24 == 0));
  }
  if (isEmpty == true) {
    ElemStack::popTop(local_a8);
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) &&
       (pXVar17 = (this->super_SGXMLScanner).super_XMLScanner.fValidator,
       iVar11 = (*pXVar17->_vptr_XMLValidator[2])(pXVar17,this_02,0,0), (char)iVar11 == '\0')) {
      pXVar17 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      pXVar23 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      iVar11 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                         (this_02);
      XMLValidator::emitError
                (pXVar17,ElementNotValidForContent,pXVar23,(XMLCh *)CONCAT44(extraout_var_06,iVar11)
                 ,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar7 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
    if (pXVar7 != (XMLDocumentHandler *)0x0) {
      (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer
      [(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
      (*pXVar7->_vptr_XMLDocumentHandler[6])(pXVar7,this_02,(ulong)local_ac,(ulong)(XVar24 == 0));
    }
    if (XVar24 == 0) {
      *local_80 = false;
    }
    else {
      pGVar3 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
               [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->
               fCurrentGrammar;
      (this->super_SGXMLScanner).super_XMLScanner.fGrammar = pGVar3;
      GVar14 = (*(pGVar3->super_XSerializable)._vptr_XSerializable[5])();
      (this->super_SGXMLScanner).fGrammarType = GVar14;
      pXVar17 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      (*pXVar17->_vptr_XMLValidator[0xb])
                (pXVar17,(this->super_SGXMLScanner).super_XMLScanner.fGrammar);
      (this->super_SGXMLScanner).super_XMLScanner.fValidate =
           (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
           [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag;
    }
  }
  return bVar8;
}

Assistant:

bool XSAXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    // Reset element content
    fContent.reset();

    //  The current position is after the open bracket, so we need to read in
    //  in the element name.
    int prefixColonPos;
    if (!fReaderMgr.getQName(fQNameBuf, &prefixColonPos))
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  First we have to do the rawest attribute scan. We don't do any
    //  normalization of them at all, since we don't know yet what type they
    //  might be (since we need the element decl in order to do that.)
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    bool isEmpty;
    XMLSize_t attCount = rawAttrScan(qnameRawBuf, *fRawAttrList, isEmpty);

    // save the contentleafname and currentscope before addlevel, for later use
    ContentLeafNameTypeVector* cv = 0;
    XMLContentModel* cm = 0;
    unsigned int currentScope = Grammar::TOP_LEVEL_SCOPE;
    bool laxThisOne = false;
    if (!isRoot)
    {
        // schema validator will have correct type if validating
        SchemaElementDecl* tempElement = (SchemaElementDecl*)
            fElemStack.topElement()->fThisElement;
        SchemaElementDecl::ModelTypes modelType = tempElement->getModelType();
        ComplexTypeInfo *currType = 0;

        if (fValidate)
        {
            currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
            if (currType)
                modelType = (SchemaElementDecl::ModelTypes)currType->getContentType();
            else // something must have gone wrong
                modelType = SchemaElementDecl::Any;
        }
        else {
            currType = tempElement->getComplexTypeInfo();
        }

        if ((modelType == SchemaElementDecl::Mixed_Simple)
          ||  (modelType == SchemaElementDecl::Mixed_Complex)
          ||  (modelType == SchemaElementDecl::Children))
        {
            cm = currType->getContentModel();
            cv = cm->getContentLeafNameTypeVector();
            currentScope = fElemStack.getCurrentScope();
        }
        else if (modelType == SchemaElementDecl::Any) {
            laxThisOne = true;
        }
    }

    //  Now, since we might have to update the namespace map for this element,
    //  but we don't have the element decl yet, we just tell the element stack
    //  to expand up to get ready.
    XMLSize_t elemDepth = fElemStack.addLevel();
    fElemStack.setValidationFlag(fValidate);
    fElemStack.setPrefixColonPos(prefixColonPos);

    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    if (attCount)
        scanRawAttrListforNameSpaces(attCount);

    //  Resolve the qualified name to a URI and name so that we can look up
    //  the element decl for this element. We have now update the prefix to
    //  namespace map so we should get the correct element now.
    unsigned int uriId = resolveQNameWithColon
    (
        qnameRawBuf, fPrefixBuf, ElemStack::Mode_Element, prefixColonPos
    );

    //if schema, check if we should lax or skip the validation of this element
    bool parentValidation = fValidate;
    if (cv) {
        QName element(fPrefixBuf.getRawBuffer(), &qnameRawBuf[prefixColonPos + 1], uriId, fMemoryManager);
        // elementDepth will be > 0, as cv is only constructed if element is not
        // root.
        laxThisOne = laxElementValidation(&element, cv, cm, elemDepth - 1);
    }

    //  Look up the element now in the grammar. This will get us back a
    //  generic element decl object. We tell him to fault one in if he does
    //  not find it.
    bool wasAdded = false;
    const XMLCh* nameRawBuf = &qnameRawBuf[prefixColonPos + 1];
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        uriId, nameRawBuf, qnameRawBuf, currentScope
    );

    if (!elemDecl)
    {
        // URI is different, so we try to switch grammar
        if (uriId != fURIStringPool->getId(fGrammar->getTargetNamespace())) {
            switchGrammar(getURIText(uriId), laxThisOne);
        }

        // look for a global element declaration
        elemDecl = fGrammar->getElemDecl(
            uriId, nameRawBuf, qnameRawBuf, Grammar::TOP_LEVEL_SCOPE
        );

        if (!elemDecl)
        {
            // if still not found, look in list of undeclared elements
            elemDecl = fElemNonDeclPool->getByKey(
                nameRawBuf, uriId, (int)Grammar::TOP_LEVEL_SCOPE);

            if (!elemDecl)
            {
                elemDecl = new (fMemoryManager) SchemaElementDecl
                (
                    fPrefixBuf.getRawBuffer(), nameRawBuf, uriId
                    , SchemaElementDecl::Any, Grammar::TOP_LEVEL_SCOPE
                    , fMemoryManager
                );

                elemDecl->setId (fElemNonDeclPool->put(
                      (void*)elemDecl->getBaseName(),
                      uriId,
                      (int)Grammar::TOP_LEVEL_SCOPE,
                      (SchemaElementDecl*)elemDecl));

                wasAdded = true;
            }
		}
    }

    //  We do something different here according to whether we found the
    //  element or not.
    bool bXsiTypeSet= (fValidator)?((SchemaValidator*)fValidator)->getIsXsiTypeSet():false;
    if (wasAdded || !elemDecl->isDeclared())
    {
        if (laxThisOne && !bXsiTypeSet) {
            fValidate = false;
            fElemStack.setValidationFlag(fValidate);
        }

        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the grammar pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            if(!bXsiTypeSet)
                fValidator->emitError
                (
                    XMLValid::ElementNotDefined, elemDecl->getFullName()
                );
        }
    }

    //  Now we can update the element stack to set the current element
    //  decl. We expanded the stack above, but couldn't store the element
    //  decl because we didn't know it yet.
    fElemStack.setElement(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setCurrentURI(uriId);

    if (isRoot) {
        fRootElemName = XMLString::replicate(qnameRawBuf, fMemoryManager);
    }

    //  Validate the element
    if (fValidate) {
        fValidator->validateElement(elemDecl);
    }

    // squirrel away the element's QName, so that we can do an efficient
    // end-tag match
    fElemStack.setCurrentSchemaElemName(fQNameBuf.getRawBuffer());

    ComplexTypeInfo* typeinfo = (fValidate)
        ? ((SchemaValidator*)fValidator)->getCurrentTypeInfo()
        : ((SchemaElementDecl*) elemDecl)->getComplexTypeInfo();

    if (typeinfo)
    {
        currentScope = typeinfo->getScopeDefined();

        // switch grammar if the typeinfo has a different grammar
        XMLCh* typeName = typeinfo->getTypeName();
        int comma = XMLString::indexOf(typeName, chComma);
        if (comma > 0)
        {
            XMLBufBid bbPrefix(&fBufMgr);
            XMLBuffer& prefixBuf = bbPrefix.getBuffer();

            prefixBuf.append(typeName, comma);
            switchGrammar(prefixBuf.getRawBuffer(), laxThisOne);
        }
    }
    fElemStack.setCurrentScope(currentScope);

    // Set element next state
    if (elemDepth >= fElemStateSize) {
        resizeElemState();
    }

    fElemState[elemDepth] = 0;
    fElemLoopState[elemDepth] = 0;
    fElemStack.setCurrentGrammar(fGrammar);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (!isRoot && parentValidation) {
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(*fRawAttrList, attCount, elemDecl, *fAttrList);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    // Since the element may have default values, call start tag now regardless if it is empty or not
    // If we have a document handler, then tell it about this start tag
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl, uriId, fPrefixBuf.getRawBuffer(), *fAttrList
            , attCount, false, isRoot
        );
    } // may be where we output something...

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                // REVISIT:  in the case of xsi:type, this may
                // return the wrong string...
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // If we have a doc handler, tell it about the end tag
        if (fDocHandler)
        {
            fDocHandler->endElement
            (
                *elemDecl, uriId, isRoot, fPrefixBuf.getRawBuffer()
            );
        }

        // If the elem stack is empty, then it was an empty root
        if (isRoot) {
            gotData = false;
        }
        else
        {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            fValidator->setGrammar(fGrammar);

            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    return true;
}